

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_pcallk(lua_State *L,int nargs,int nresults,int errfunc,lua_KContext ctx,lua_KFunction k)

{
  CallInfo *pCVar1;
  int iVar2;
  TValue *pTVar3;
  ptrdiff_t ef;
  CallS c;
  StkId local_38;
  int local_30;
  
  if (errfunc == 0) {
    ef = 0;
  }
  else {
    pTVar3 = index2addr(L,errfunc);
    ef = (long)pTVar3 - (long)L->stack;
  }
  local_38 = L->top + ~nargs;
  if ((k == (lua_KFunction)0x0) || (L->nny != 0)) {
    local_30 = nresults;
    iVar2 = luaD_pcall(L,f_call,&local_38,(long)local_38 - (long)L->stack,ef);
  }
  else {
    pCVar1 = L->ci;
    (pCVar1->u).c.k = k;
    (pCVar1->u).c.ctx = ctx;
    pCVar1->extra = (long)local_38 - (long)L->stack;
    (pCVar1->u).l.savedpc = (Instruction *)L->errfunc;
    L->errfunc = ef;
    pCVar1->callstatus = (ushort)L->allowhook | pCVar1->callstatus & 0xffee | 0x10;
    luaD_call(L,local_38,nresults);
    *(byte *)&pCVar1->callstatus = (byte)pCVar1->callstatus & 0xef;
    L->errfunc = (ptrdiff_t)(pCVar1->u).l.savedpc;
    iVar2 = 0;
  }
  if (nresults == -1) {
    if (L->ci->top < L->top) {
      L->ci->top = L->top;
    }
  }
  return iVar2;
}

Assistant:

LUA_API int lua_pcallk (lua_State *L, int nargs, int nresults, int errfunc,
                        lua_KContext ctx, lua_KFunction k) {
  struct CallS c;
  int status;
  ptrdiff_t func;
  lua_lock(L);
  api_check(L, k == NULL || !isLua(L->ci),
    "cannot use continuations inside hooks");
  api_checknelems(L, nargs+1);
  api_check(L, L->status == LUA_OK, "cannot do calls on non-normal thread");
  checkresults(L, nargs, nresults);
  if (errfunc == 0)
    func = 0;
  else {
    StkId o = index2addr(L, errfunc);
    api_checkstackindex(L, errfunc, o);
    func = savestack(L, o);
  }
  c.func = L->top - (nargs+1);  /* function to be called */
  if (k == NULL || L->nny > 0) {  /* no continuation or no yieldable? */
    c.nresults = nresults;  /* do a 'conventional' protected call */
    status = luaD_pcall(L, f_call, &c, savestack(L, c.func), func);
  }
  else {  /* prepare continuation (call is already protected by 'resume') */
    CallInfo *ci = L->ci;
    ci->u.c.k = k;  /* save continuation */
    ci->u.c.ctx = ctx;  /* save context */
    /* save information for error recovery */
    ci->extra = savestack(L, c.func);
    ci->u.c.old_errfunc = L->errfunc;
    L->errfunc = func;
    setoah(ci->callstatus, L->allowhook);  /* save value of 'allowhook' */
    ci->callstatus |= CIST_YPCALL;  /* function can do error recovery */
    luaD_call(L, c.func, nresults);  /* do the call */
    ci->callstatus &= ~CIST_YPCALL;
    L->errfunc = ci->u.c.old_errfunc;
    status = LUA_OK;  /* if it is here, there were no errors */
  }
  adjustresults(L, nresults);
  lua_unlock(L);
  return status;
}